

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void parasail_matrix_set_value(parasail_matrix_t *matrix,int row,int col,int value)

{
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_matrix_set_value_cold_2();
  }
  else if (matrix->user_matrix == (int *)0x0) {
    parasail_matrix_set_value_cold_1();
  }
  else {
    matrix->user_matrix[row * matrix->size + col] = value;
    if (matrix->max < value) {
      matrix->max = value;
    }
    if (value < matrix->min) {
      matrix->min = value;
    }
  }
  return;
}

Assistant:

void parasail_matrix_set_value(parasail_matrix_t *matrix, int row, int col, int value)
{
    PARASAIL_CHECK_NULL_NORETVAL(matrix);

    if (NULL == matrix->user_matrix) {
        fprintf(stderr, "%s: attempted to set value of built-in matrix '%s'\n",
                __func__, matrix->name);
        return;
    }

    matrix->user_matrix[row*matrix->size + col] = value;
    if (value > matrix->max) {
        matrix->max = value;
    }
    if (value < matrix->min) {
        matrix->min = value;
    }
}